

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O0

bool __thiscall
iDynTree::ModelLoader::loadModelFromFile
          (ModelLoader *this,string *filename,string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageDirs)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *this_00;
  string *in_RSI;
  Model *in_stack_00000018;
  ModelLoaderPimpl *in_stack_00000020;
  shared_ptr<const_iDynTree::URDFDocument> urdfDocument;
  shared_ptr<const_iDynTree::XMLDocument> document;
  anon_class_40_1_197c2f9f documentFactoryWithOptions;
  ModelParserOptions parserOptions;
  shared_ptr<iDynTree::XMLParser> parser;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  ModelParserOptions *in_stack_fffffffffffffed0;
  anon_class_40_1_197c2f9f *in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  __shared_ptr local_100 [36];
  undefined4 local_dc;
  string local_d8 [32];
  undefined1 local_b8 [160];
  string *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  std::make_shared<iDynTree::XMLParser>();
  std::
  unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
  ::operator->((unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                *)0x187a3b);
  ModelParserOptions::ModelParserOptions
            (in_stack_fffffffffffffed0,
             (ModelParserOptions *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  ModelParserOptions::ModelParserOptions
            (in_stack_fffffffffffffed0,
             (ModelParserOptions *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  peVar3 = std::__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x187a78);
  std::function<std::shared_ptr<iDynTree::XMLDocument>(iDynTree::XMLParserState&)>::
  function<iDynTree::ModelLoader::loadModelFromFile(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0&,void>
            ((function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *)
             CONCAT17(in_stack_fffffffffffffee7,
                      CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)),
             in_stack_fffffffffffffed8);
  iDynTree::XMLParser::setDocumentFactory(peVar3,local_b8);
  std::function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>::~function
            ((function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *)
             0x187ab5);
  peVar3 = std::__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x187ac2);
  iDynTree::XMLParser::setPackageDirs((vector *)peVar3);
  peVar3 = std::__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x187ae1);
  std::__cxx11::string::string(local_d8,local_18);
  bVar1 = iDynTree::XMLParser::parseXMLFile(peVar3,local_d8);
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_d8);
  if ((bVar1 & 1) == 0) {
    std::__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x187c02);
    iDynTree::XMLParser::document();
    std::dynamic_pointer_cast<iDynTree::URDFDocument_const,iDynTree::XMLDocument_const>
              ((shared_ptr<const_iDynTree::XMLDocument> *)peVar3);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_100);
    if (bVar2) {
      std::
      unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
      ::operator->((unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                    *)0x187c93);
      this_00 = std::
                __shared_ptr_access<const_iDynTree::URDFDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_iDynTree::URDFDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x187ca2);
      URDFDocument::model(this_00);
      local_1 = ModelLoaderPimpl::setModel(in_stack_00000020,in_stack_00000018);
    }
    else {
      iDynTree::reportError
                ("ModelLoader","loadModelFromFile","Fatal error in retrieving the parsed model.");
      local_1 = false;
    }
    local_dc = 1;
    std::shared_ptr<const_iDynTree::URDFDocument>::~shared_ptr
              ((shared_ptr<const_iDynTree::URDFDocument> *)0x187ce5);
    std::shared_ptr<const_iDynTree::XMLDocument>::~shared_ptr
              ((shared_ptr<const_iDynTree::XMLDocument> *)0x187cef);
  }
  else {
    iDynTree::reportError("ModelLoader","loadModelFromFile","Error in parsing model from URDF.");
    local_1 = false;
    local_dc = 1;
  }
  loadModelFromFile(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::~__0((anon_class_40_1_197c2f9f *)0x187cfc);
  ModelParserOptions::~ModelParserOptions((ModelParserOptions *)0x187d09);
  std::shared_ptr<iDynTree::XMLParser>::~shared_ptr((shared_ptr<iDynTree::XMLParser> *)0x187d16);
  return (bool)(local_1 & 1);
}

Assistant:

bool ModelLoader::loadModelFromFile(const std::string& filename,
                                        const std::string& /*filetype*/,
                                        const std::vector<std::string>& packageDirs /* = {} */)
    {
        // Allocate parser
        std::shared_ptr<XMLParser> parser = std::make_shared<XMLParser>();
        auto parserOptions =  this->m_pimpl->m_options;
        auto documentFactoryWithOptions = [parserOptions](XMLParserState& state){
            return std::shared_ptr<XMLDocument>(new URDFDocument(state, parserOptions));
            };
        parser->setDocumentFactory(documentFactoryWithOptions);
        parser->setPackageDirs(packageDirs);
        if (!parser->parseXMLFile(filename)) {
            reportError("ModelLoader", "loadModelFromFile", "Error in parsing model from URDF.");
            return false;
        }
        // Retrieving the parsed document, which is an instance of URDFDocument
        std::shared_ptr<const XMLDocument> document = parser->document();
        std::shared_ptr<const URDFDocument> urdfDocument = std::dynamic_pointer_cast<const URDFDocument>(document);
        if (!urdfDocument) {
            reportError("ModelLoader", "loadModelFromFile", "Fatal error in retrieving the parsed model.");
            return false;
        }

        return m_pimpl->setModel(urdfDocument->model());
    }